

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O1

vector<Image,_std::allocator<Image>_> *
anon_unknown.dwarf_4e23::LoadEgaSpritesheet
          (vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer pcVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  color_t *__cur;
  long lVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong __n;
  pointer pIVar12;
  long lVar13;
  long lVar14;
  int byte_column;
  long lVar15;
  allocator_type local_89;
  vector<Image,_std::allocator<Image>_> *local_88;
  value_type local_50;
  
  uVar11 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_50.width_ = 0xf;
  local_50.height_ = 0xf;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2a3);
  pcVar1 = local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
           super__Vector_impl_data._M_start + 0xe1;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar1;
  memset(local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x2a3);
  __n = uVar11 >> 8;
  local_88 = __return_storage_ptr__;
  local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar1;
  std::vector<Image,_std::allocator<Image>_>::vector(__return_storage_ptr__,__n,&local_50,&local_89)
  ;
  if (local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0xff < uVar11) {
    lVar10 = 0;
    do {
      pIVar12 = (local_88->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar10;
      lVar6 = 0;
      do {
        lVar9 = lVar6 * 0x10 + (ulong)(uint)((int)lVar10 << 8);
        lVar14 = 0;
        lVar15 = 0;
        do {
          iVar8 = 6;
          lVar13 = lVar14;
          do {
            if ((uint)lVar13 < 0xf) {
              puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              bVar7 = (byte)iVar8;
              lVar5 = (ulong)((puVar2[lVar15 + lVar9 + 0xc] >> (bVar7 & 0x1f) & 2 |
                              (byte)((puVar2[lVar15 + lVar9 + 0x10] >> (bVar7 & 0x1f)) >> 1) & 1) +
                              (puVar2[lVar15 + lVar9 + 8] >> (bVar7 & 0x1f) & 2) * 2 +
                             (puVar2[lVar15 + lVar9 + 4] >> (bVar7 & 0x1f) & 2) * 4) * 3;
              lVar3 = *(long *)&(pIVar12->pixels_).
                                super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
                                super__Vector_impl_data;
              lVar4 = ((long)pIVar12->width_ * (long)(int)lVar6 + lVar13) * 3;
              *(undefined1 *)(lVar3 + 2 + lVar4) = (anonymous_namespace)::ega_palette[lVar5 + 2];
              *(undefined2 *)(lVar3 + lVar4) =
                   *(undefined2 *)((anonymous_namespace)::ega_palette + lVar5);
            }
            iVar8 = iVar8 + -2;
            lVar13 = lVar13 + 1;
          } while (iVar8 != -2);
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 4;
        } while (lVar15 != 4);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0xf);
      lVar10 = lVar10 + 1;
    } while (lVar10 != __n + (__n == 0));
  }
  return local_88;
}

Assistant:

std::vector<Image> LoadEgaSpritesheet(std::vector<uint8_t> const& data) {
  auto const num_images = data.size() / kImageAlignmentInBytes;
  std::vector<Image> images(num_images,
                            Image(kImageWidth, kImageHeight));  // TODO 15x15

  for (auto image_index = 0; image_index < num_images; ++image_index) {
    auto& image = images[image_index];
    auto const image_offset = image_index * kImageAlignmentInBytes;

    for (auto y = 0; y < kCellHeight - 1; ++y) {
      for (auto byte_column = 0; byte_column < kCgaBytesPerRow; ++byte_column) {
        auto const byte_offset =
            image_offset + (y * kEgaBytesPerRow) + byte_column;
        auto const next_byte_offset = byte_offset + kEgaBytesPerRow;

        for (auto halfnibble = 3; halfnibble >= 0; --halfnibble) {
          // + kCgaBytesPerRow * X    to "stride" rows
          // HalfNibble               to address a specific pixel
          // / 2                      to convert data half-nibble to bit
          // << Y                     to place bit in proper EGA index
          auto const ega = ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 1],
                                        halfnibble) /
                             2)
                            << 0x3) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 2],
                                        halfnibble) /
                             2)
                            << 0x2) |
                           ((HalfNibble(data[byte_offset + kCgaBytesPerRow * 3],
                                        halfnibble) /
                             2)
                            << 0x1) |
                           (HalfNibble(data[next_byte_offset], halfnibble) / 2);

          // Last byte of row only contains 3 pixels (because final image
          // is 15 wide, not 16 wide)
          auto const x = byte_column * kCgaBytesPerRow + (3 - halfnibble);
          if (x < kImageWidth) {
            image.Set(x, y, ega_palette[ega]);
          }
        }
      }
    }
  }

  return images;
}